

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void SpawnDeepSplash(AActor *t1,FTraceResults *trace,AActor *puff)

{
  double *pdVar1;
  long lVar2;
  sector_t_conflict *sec;
  DVector2 local_28;
  
  lVar2 = 0xb8;
  if ((trace->Crossed3DWater != (F3DFloor *)0x0) ||
     ((trace->CrossedWater != (sector_t *)0x0 &&
      (lVar2 = 0x98, trace->CrossedWater->heightsec != (sector_t *)0x0)))) {
    if (puff != (AActor *)0x0) {
      t1 = puff;
    }
    pdVar1 = (double *)((long)&trace->Sector + lVar2);
    local_28.X = *pdVar1;
    local_28.Y = pdVar1[1];
    sec = P_PointInSector(&local_28);
    P_HitWater(t1,(sector_t *)sec,(DVector3 *)((long)&trace->Sector + lVar2),false,true,false);
  }
  return;
}

Assistant:

static void SpawnDeepSplash(AActor *t1, const FTraceResults &trace, AActor *puff)
{
	const DVector3 *hitpos;
	if (trace.Crossed3DWater)
	{
		hitpos = &trace.Crossed3DWaterPos;
	}
	else if (trace.CrossedWater && trace.CrossedWater->heightsec)
	{
		hitpos = &trace.CrossedWaterPos;
	}
	else return;

	P_HitWater(puff != NULL ? puff : t1, P_PointInSector(*hitpos), *hitpos);
}